

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::mousePressEvent(QAbstractItemView *this,QMouseEvent *event)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  QAbstractItemViewPrivate *pQVar4;
  QItemSelectionModel *pQVar5;
  ulong uVar6;
  QSize *asize;
  SelectionFlag SVar7;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool autoScroll;
  QAbstractItemViewPrivate *d;
  QRect rect;
  QPoint offset;
  SelectionFlags command;
  QPersistentModelIndex index;
  QPoint pos;
  QModelIndex *in_stack_fffffffffffffdb8;
  QAbstractItemViewPrivate *in_stack_fffffffffffffdc0;
  QPoint *in_stack_fffffffffffffdc8;
  QAbstractItemViewPrivate *in_stack_fffffffffffffdd0;
  QAbstractItemViewPrivate *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 uVar8;
  int msec;
  byte local_209;
  bool local_1fa;
  bool local_1f9;
  bool local_1ee;
  undefined4 local_1cc;
  undefined1 local_1c8 [24];
  QPersistentModelIndex local_1b0 [3];
  Int local_194;
  QPersistentModelIndex local_190 [3];
  undefined1 local_178 [16];
  QPoint local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  Int local_150;
  undefined1 local_144 [16];
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_134;
  QPersistentModelIndex local_130 [3];
  undefined4 local_114;
  QPersistentModelIndex local_110 [3];
  QPersistentModelIndex local_f8 [3];
  QPersistentModelIndex local_e0 [3];
  undefined1 local_c8 [24];
  QPoint local_b0;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_a8;
  QPoint local_a4;
  QPoint local_9c;
  Int local_94;
  QPersistentModelIndex local_90 [3];
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_78;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74;
  QPersistentModelIndex local_70 [3];
  QPersistentModelIndex local_58 [3];
  undefined1 local_40 [24];
  QPersistentModelIndex local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QAbstractItemView *)0x8041d5);
  pQVar4->releaseFromDoubleClick = false;
  QBasicTimer::stop();
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QSinglePointEvent::position((QSinglePointEvent *)0x804210);
  local_10 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffdd0);
  local_28.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x1f0))(local_40,in_RDI,&local_10);
  QPersistentModelIndex::QPersistentModelIndex(&local_28,(QModelIndex *)local_40);
  bVar1 = QBasicTimer::isActive(&pQVar4->pressClosedEditorWatcher);
  local_1ee = false;
  if (bVar1) {
    local_1ee = ::operator==((QPersistentModelIndex *)in_stack_fffffffffffffdc0,
                             (QPersistentModelIndex *)in_stack_fffffffffffffdb8);
  }
  pQVar4->pressClosedEditor = local_1ee;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8042d9);
  local_1f9 = true;
  if (bVar1) {
    local_1fa = false;
    if (pQVar4->state == EditingState) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
      local_1fa = QAbstractItemViewPrivate::hasEditor
                            (in_stack_fffffffffffffdd8,(QModelIndex *)in_stack_fffffffffffffdd0);
    }
    local_1f9 = local_1fa;
  }
  if (local_1f9 == false) {
    pQVar5 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x804361);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
    bVar2 = QItemSelectionModel::isSelected((QModelIndex *)pQVar5);
    msec = (int)((ulong)pQVar5 >> 0x20);
    pQVar4->pressedAlreadySelected = (bool)(bVar2 & 1);
    QPersistentModelIndex::operator=(&pQVar4->pressedIndex,&local_28);
    local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QInputEvent::modifiers((QInputEvent *)in_stack_fffffffffffffdc0);
    (pQVar4->pressedModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
    super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (Int)local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i;
    local_78.i = 0xaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_90);
    local_94 = (**(code **)(*in_RDI + 0x2e8))(in_RDI,local_90,in_RSI);
    local_78.i = local_94;
    bVar1 = ::operator==((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
                         SUB84((ulong)in_stack_fffffffffffffdc8 >> 0x20,0),
                         (SelectionFlag)in_stack_fffffffffffffdc0);
    local_209 = 1;
    if (!bVar1) {
      local_209 = QPersistentModelIndex::isValid();
      local_209 = local_209 ^ 0xff;
    }
    pQVar4->noSelectionOnMousePress = (bool)(local_209 & 1);
    local_9c = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_9c = QAbstractItemViewPrivate::offset(in_stack_fffffffffffffdd0);
    local_a4 = ::operator+((QPoint *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    pQVar4->draggedPosition = local_a4;
    if ((pQVar4->dragEnabled & 1U) != 0) {
      pQVar4->pressedPosition = pQVar4->draggedPosition;
    }
    local_a8.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdc0,
                    (SelectionFlag)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    bVar1 = QFlags<QItemSelectionModel::SelectionFlag>::operator!
                      ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_a8);
    if (bVar1) {
      local_b0 = ::operator+((QPoint *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pQVar4->pressedPosition = local_b0;
      QPersistentModelIndex::operator=(&pQVar4->currentSelectionStartIndex,&local_28);
    }
    else {
      uVar6 = QPersistentModelIndex::isValid();
      if ((uVar6 & 1) == 0) {
        currentIndex((QAbstractItemView *)in_stack_fffffffffffffdd0);
        QPersistentModelIndex::operator=
                  (&pQVar4->currentSelectionStartIndex,(QModelIndex *)local_c8);
      }
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_e0);
    uVar6 = (**(code **)(*in_RDI + 0x2e0))(in_RDI,local_e0,0,in_RSI);
    if ((uVar6 & 1) == 0) {
      uVar3 = QPersistentModelIndex::isValid();
      uVar8 = false;
      if ((uVar3 & 1) != 0) {
        in_stack_fffffffffffffdd8 = pQVar4;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
        uVar8 = QAbstractItemViewPrivate::isIndexEnabled
                          (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      }
      if ((bool)uVar8 == false) {
        pQVar5 = QPointer<QItemSelectionModel>::operator->
                           ((QPointer<QItemSelectionModel> *)0x80491a);
        QModelIndex::QModelIndex((QModelIndex *)0x80492b);
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdc0,
                   (SelectionFlag)((ulong)pQVar5 >> 0x20));
        (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,local_1c8,local_1cc);
      }
      else {
        bVar1 = pQVar4->autoScroll;
        pQVar4->autoScroll = false;
        asize = (QSize *)QPointer<QItemSelectionModel>::operator->
                                   ((QPointer<QItemSelectionModel> *)0x80466e);
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdc0,
                   (SelectionFlag)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        (**(code **)((long)*asize + 0x60))(asize,local_110,local_114);
        pQVar4->autoScroll = (bool)(bVar1 & 1);
        bVar1 = QFlags<QItemSelectionModel::SelectionFlag>::testFlag
                          ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdc0,
                           (SelectionFlag)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        if (bVar1) {
          QFlags<QItemSelectionModel::SelectionFlag>::operator&=
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_78,-9);
          in_stack_fffffffffffffdc8 =
               (QPoint *)
               QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x804701);
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_130);
          bVar2 = QItemSelectionModel::isSelected((QModelIndex *)in_stack_fffffffffffffdc8);
          SVar7 = Select;
          if ((bVar2 & 1) != 0) {
            SVar7 = Deselect;
          }
          pQVar4->ctrlDragSelectionFlag = SVar7;
          QFlags<QItemSelectionModel::SelectionFlag>::operator|=
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_78,
                     pQVar4->ctrlDragSelectionFlag);
        }
        local_134.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdc0,
                        (SelectionFlag)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        bVar1 = QFlags<QItemSelectionModel::SelectionFlag>::operator!
                          ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_134);
        if (bVar1) {
          QSize::QSize((QSize *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                       (int)in_stack_fffffffffffffdb8);
          QRect::QRect((QRect *)CONCAT17(uVar8,in_stack_fffffffffffffde0),
                       (QPoint *)in_stack_fffffffffffffdd8,asize);
          local_150 = local_78.i;
          (**(code **)(*in_RDI + 0x2c8))(in_RDI,local_144,local_78.i);
        }
        else {
          local_160 = &DAT_aaaaaaaaaaaaaaaa;
          local_158 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_190);
          local_178 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,local_190);
          local_168 = QRect::center((QRect *)CONCAT17(uVar8,in_stack_fffffffffffffde0));
          QRect::QRect((QRect *)CONCAT17(uVar8,in_stack_fffffffffffffde0),
                       (QPoint *)in_stack_fffffffffffffdd8,(QPoint *)asize);
          local_194 = local_78.i;
          (**(code **)(*in_RDI + 0x2c8))(in_RDI,&local_160,local_78.i);
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_1b0);
        pressed((QAbstractItemView *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        if ((pQVar4->autoScroll & 1U) != 0) {
          QApplication::doubleClickInterval();
          QBasicTimer::start((QBasicTimer *)asize,msec,(QObject *)in_stack_fffffffffffffdc8);
        }
      }
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    d->releaseFromDoubleClick = false;
    d->delayedAutoScroll.stop(); //any interaction with the view cancel the auto scrolling
    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    // this is the mouse press event that closed the last editor (via focus event)
    d->pressClosedEditor = d->pressClosedEditorWatcher.isActive() && d->lastEditedIndex == index;

    if (!d->selectionModel || (d->state == EditingState && d->hasEditor(index)))
        return;

    d->pressedAlreadySelected = d->selectionModel->isSelected(index);
    d->pressedIndex = index;
    d->pressedModifiers = event->modifiers();
    QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
    d->noSelectionOnMousePress = command == QItemSelectionModel::NoUpdate || !index.isValid();
    QPoint offset = d->offset();
    d->draggedPosition = pos + offset;

#if QT_CONFIG(draganddrop)
    // update the pressed position when drag was enable
    if (d->dragEnabled)
        d->pressedPosition = d->draggedPosition;
#endif

    if (!(command & QItemSelectionModel::Current)) {
        d->pressedPosition = pos + offset;
        d->currentSelectionStartIndex = index;
    }
    else if (!d->currentSelectionStartIndex.isValid())
        d->currentSelectionStartIndex = currentIndex();

    if (edit(index, NoEditTriggers, event))
        return;

    if (index.isValid() && d->isIndexEnabled(index)) {
        // we disable scrollTo for mouse press so the item doesn't change position
        // when the user is interacting with it (ie. clicking on it)
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        d->autoScroll = autoScroll;
        if (command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            d->ctrlDragSelectionFlag = d->selectionModel->isSelected(index) ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command |= d->ctrlDragSelectionFlag;
        }

        if (!(command & QItemSelectionModel::Current)) {
            setSelection(QRect(pos, QSize(1, 1)), command);
        } else {
            QRect rect(visualRect(d->currentSelectionStartIndex).center(), pos);
            setSelection(rect, command);
        }

        // signal handlers may change the model
        emit pressed(index);
        if (d->autoScroll) {
            //we delay the autoscrolling to filter out double click event
            //100 is to be sure that there won't be a double-click misinterpreted as a 2 single clicks
            d->delayedAutoScroll.start(QApplication::doubleClickInterval()+100, this);
        }

    } else {
        // Forces a finalize() even if mouse is pressed, but not on a item
        d->selectionModel->select(QModelIndex(), QItemSelectionModel::Select);
    }
}